

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O1

int uv_tcp_nodelay(uv_tcp_t *handle,int on)

{
  int err;
  int on_local;
  uv_tcp_t *handle_local;
  
  if (((handle->io_watcher).fd == -1) ||
     (handle_local._4_4_ = uv__tcp_nodelay((handle->io_watcher).fd,on), handle_local._4_4_ == 0)) {
    if (on == 0) {
      handle->flags = handle->flags & 0xfeffffff;
    }
    else {
      handle->flags = handle->flags | 0x1000000;
    }
    handle_local._4_4_ = 0;
  }
  return handle_local._4_4_;
}

Assistant:

int uv_tcp_nodelay(uv_tcp_t* handle, int on) {
  int err;

  if (uv__stream_fd(handle) != -1) {
    err = uv__tcp_nodelay(uv__stream_fd(handle), on);
    if (err)
      return err;
  }

  if (on)
    handle->flags |= UV_HANDLE_TCP_NODELAY;
  else
    handle->flags &= ~UV_HANDLE_TCP_NODELAY;

  return 0;
}